

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

void al_remove_path_component(ALLEGRO_PATH *path,int i)

{
  size_t sVar1;
  int in_ESI;
  long in_RDI;
  uint in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 0) {
    sVar1 = _al_vector_size((_AL_VECTOR *)(in_RDI + 0x10));
    in_ESI = (int)sVar1 + in_ESI;
  }
  get_segment((ALLEGRO_PATH *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  al_ustr_free((ALLEGRO_USTR *)0x17c5b4);
  _al_vector_delete_at
            ((_AL_VECTOR *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void al_remove_path_component(ALLEGRO_PATH *path, int i)
{
   ASSERT(path);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   al_ustr_free(get_segment(path, i));
   _al_vector_delete_at(&path->segments, i);
}